

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * __thiscall QByteArray::insert(QByteArray *this,qsizetype i,QByteArrayView data)

{
  long lVar1;
  long lVar2;
  Data *pDVar3;
  char *pcVar4;
  QByteArrayView data_00;
  char *data_01;
  long n;
  long in_FS_OFFSET;
  char *str;
  QVarLengthArray<char,_256LL> a;
  
  data_01 = data.m_data;
  n = data.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str = data_01;
  if (0 < n && -1 < i) {
    lVar2 = (this->d).size;
    if (i < lVar2) {
      pDVar3 = (this->d).d;
      if (((pDVar3 == (Data *)0x0) ||
          (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
         (pcVar4 = (this->d).ptr, pcVar4 + lVar2 <= data_01 || data_01 < pcVar4)) {
        QtPrivate::QPodArrayOps<char>::insert((QPodArrayOps<char> *)this,i,data_01,n);
        (this->d).ptr[(this->d).size] = '\0';
      }
      else {
        memset(&a,0xaa,0x118);
        QVarLengthArray<char,_256LL>::QVarLengthArray<const_char_*,_true>(&a,data_01,data_01 + n);
        data_00.m_data = (storage_type *)a.super_QVLABase<char>.super_QVLABaseBase.ptr;
        data_00.m_size = a.super_QVLABase<char>.super_QVLABaseBase.s;
        this = insert(this,i,data_00);
        QVarLengthArray<char,_256LL>::~QVarLengthArray(&a);
      }
    }
    else {
      a.super_QVLABase<char>.super_QVLABaseBase.ptr = (void *)0x0;
      a.super_QVLABase<char>.super_QVLABaseBase.a = 0;
      a.super_QVLABase<char>.super_QVLABaseBase.s = 0;
      QArrayDataPointer<char>::detachAndGrow
                (&this->d,GrowsAtEnd,(n + i) - lVar2,&str,(QArrayDataPointer<char> *)&a);
      if ((this->d).ptr == (char *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          qBadAlloc();
        }
        goto LAB_002d1ad0;
      }
      QtPrivate::QPodArrayOps<char>::copyAppend((QPodArrayOps<char> *)this,i - (this->d).size,' ');
      QtPrivate::QPodArrayOps<char>::copyAppend((QPodArrayOps<char> *)this,str,str + n);
      (this->d).ptr[(this->d).size] = '\0';
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&a);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
LAB_002d1ad0:
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::insert(qsizetype i, QByteArrayView data)
{
    const char *str = data.data();
    qsizetype size = data.size();
    if (i < 0 || size <= 0)
        return *this;

    // handle this specially, as QArrayDataOps::insert() doesn't handle out of
    // bounds positions
    if (i >= d->size) {
        // In case when data points into the range or is == *this, we need to
        // defer a call to free() so that it comes after we copied the data from
        // the old memory:
        DataPointer detached{};  // construction is free
        d.detachAndGrow(Data::GrowsAtEnd, (i - d.size) + size, &str, &detached);
        Q_CHECK_PTR(d.data());
        d->copyAppend(i - d->size, ' ');
        d->copyAppend(str, str + size);
        d.data()[d.size] = '\0';
        return *this;
    }

    if (!d->needsDetach() && QtPrivate::q_points_into_range(str, d)) {
        QVarLengthArray a(str, str + size);
        return insert(i, a);
    }

    d->insert(i, str, size);
    d.data()[d.size] = '\0';
    return *this;
}